

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dunk.c
# Opt level: O2

void envy_bios_print_spreadspectrum(envy_bios *bios,FILE *out,uint mask)

{
  byte bVar1;
  envy_bios_spreadspectrum_entry *peVar2;
  ushort uVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t sVar7;
  
  uVar3 = (bios->spreadspectrum).offset;
  if ((mask >> 0x16 & 1) == 0 || uVar3 == 0) {
    return;
  }
  bVar1 = (bios->spreadspectrum).version;
  uVar6 = (ulong)(bVar1 >> 4);
  uVar5 = (ulong)(bVar1 & 0xf);
  if ((bios->spreadspectrum).valid == '\0') {
    fprintf((FILE *)out,"Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n\n",
            (ulong)uVar3,uVar6,uVar5);
    return;
  }
  fprintf((FILE *)out,"SPREADSPECTRUM table at 0x%04x version %d.%d",(ulong)uVar3,uVar6,uVar5);
  uVar6 = (ulong)(bios->spreadspectrum).unk04;
  if ((bios->spreadspectrum).version < 0x41) {
    fprintf((FILE *)out," unk04 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x\n",uVar6,
            (ulong)(bios->spreadspectrum).unk05,(ulong)(bios->spreadspectrum).unk06,
            (ulong)(bios->spreadspectrum).unk07,(ulong)(bios->spreadspectrum).unk08,
            (ulong)(bios->spreadspectrum).unk09);
  }
  else {
    fprintf((FILE *)out," unk04 0x%02x\n",uVar6);
  }
  envy_bios_dump_hex(bios,out,(uint)(bios->spreadspectrum).offset,(uint)(bios->spreadspectrum).hlen,
                     mask);
  uVar6 = 0;
  do {
    if ((bios->spreadspectrum).entriesnum <= uVar6) {
      fputc(10,(FILE *)out);
      return;
    }
    peVar2 = (bios->spreadspectrum).entries;
    envy_bios_dump_hex(bios,out,(uint)peVar2[uVar6].offset,(uint)(bios->spreadspectrum).rlen,mask);
    if ((peVar2[uVar6].unk00 & 1) == 0) {
      fprintf((FILE *)out,"SPREADSPECTRUM %d: INVALID 0x%02x",uVar6 & 0xffffffff);
      if (1 < (bios->spreadspectrum).rlen) {
        fprintf((FILE *)out," 0x%02x",(ulong)peVar2[uVar6].unk01);
      }
      goto LAB_002540aa;
    }
    fprintf((FILE *)out,"SPREADSPECTRUM %d: ",uVar6 & 0xffffffff);
    fprintf((FILE *)out,"idx(%1x) ",(ulong)(peVar2[uVar6].unk00 >> 4 & 1));
    switch(peVar2[uVar6].unk00 & 6) {
    case 0:
      pcVar4 = "SRC_INTERNAL_0 ";
      goto LAB_00254030;
    case 2:
      pcVar4 = "SRC_INTERNAL_1 ";
LAB_00254030:
      sVar7 = 0xf;
      break;
    case 4:
      pcVar4 = "SRC_EXTERNAL ";
      sVar7 = 0xd;
      break;
    case 6:
      pcVar4 = "SRC_PLL ";
      sVar7 = 8;
    }
    fwrite(pcVar4,sVar7,1,(FILE *)out);
    uVar3 = peVar2[uVar6].unk01 & 0x3f;
    fprintf((FILE *)out,"SPREAD(%d.%02d%%) ",(ulong)(byte)(uVar3 / 0x14),
            (ulong)((ushort)(uVar3 * 5) % 100));
    if ((peVar2[uVar6].unk01 & 0x70) == 0) {
      pcVar4 = "CENTER";
      sVar7 = 6;
    }
    else {
      pcVar4 = "DOWN";
      sVar7 = 4;
    }
    fwrite(pcVar4,sVar7,1,(FILE *)out);
LAB_002540aa:
    fputc(10,(FILE *)out);
    uVar6 = uVar6 + 1;
  } while( true );
}

Assistant:

void envy_bios_print_spreadspectrum (struct envy_bios *bios, FILE *out, unsigned mask) {
	struct envy_bios_spreadspectrum *spreadspectrum = &bios->spreadspectrum;
	if (!spreadspectrum->offset || !(mask & ENVY_BIOS_PRINT_DUNK))
		return;
	if (!spreadspectrum->valid) {
		fprintf(out, "Failed to parse SPREADSPECTRUM table at 0x%04x version %d.%d\n\n", spreadspectrum->offset, spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
		return;
	}
	fprintf(out, "SPREADSPECTRUM table at 0x%04x version %d.%d", spreadspectrum->offset, spreadspectrum->version >> 4, spreadspectrum->version & 0xf);
	if (spreadspectrum->version < 0x41) {
		fprintf (out, " unk04 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x 0x%02x\n", spreadspectrum->unk04, spreadspectrum->unk05, spreadspectrum->unk06, spreadspectrum->unk07, spreadspectrum->unk08, spreadspectrum->unk09);
	} else {
		fprintf (out, " unk04 0x%02x\n", spreadspectrum->unk04);
	}
	envy_bios_dump_hex(bios, out, spreadspectrum->offset, spreadspectrum->hlen, mask);
	int i;
	for (i = 0; i < spreadspectrum->entriesnum; i++) {
		unsigned int spread;
		struct envy_bios_spreadspectrum_entry *entry = &spreadspectrum->entries[i];
		envy_bios_dump_hex(bios, out, entry->offset, spreadspectrum->rlen, mask);
		if(!(entry->unk00 & 0x1)) {
			fprintf(out, "SPREADSPECTRUM %d: INVALID 0x%02x", i, entry->unk00);
						
			if (spreadspectrum->rlen >= 2)
				fprintf(out, " 0x%02x", entry->unk01);
		} else {
			fprintf(out, "SPREADSPECTRUM %d: ", i);
			fprintf(out, "idx(%1x) ", (entry->unk00 & 0x10) >> 4);
			switch(entry->unk00 & 0x6) {
			case 0x0:
				fprintf(out, "SRC_INTERNAL_0 ");
				break;
			case 0x2:
				fprintf(out, "SRC_INTERNAL_1 ");
				break;
			case 0x4:
				fprintf(out, "SRC_EXTERNAL ");
				break;
			case 0x6:
				fprintf(out, "SRC_PLL ");
				break;
			}
			spread = (entry->unk01 & 0x3f) * 5;
			fprintf(out, "SPREAD(%d.%02d%%) ", spread / 100, spread % 100);
			
			if(entry->unk01 & 0x70)
				fprintf(out, "DOWN");
			else
				fprintf(out, "CENTER");
		}
		fprintf(out, "\n");
	}
	fprintf(out, "\n");
}